

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlatest.cpp
# Opt level: O1

bool TestAnalogInputs(int curLine,AmpIO *Board,BasePort *Port,ofstream *logFile,uint qlaNum)

{
  char cVar1;
  ofstream *poVar2;
  int iVar3;
  int iVar4;
  uint32_t uVar5;
  ostream *poVar6;
  ulong uVar7;
  uint uVar8;
  char *__format;
  bool bVar9;
  long lVar10;
  undefined1 auVar11 [16];
  double measured;
  double potV [4];
  unsigned_long pot [4];
  char buf [80];
  double local_f0;
  undefined8 local_e8 [4];
  BasePort *local_c8;
  double dStack_c0;
  ofstream *local_b8;
  ulong local_b0;
  ulong local_a8 [4];
  char local_88 [88];
  
  local_c8 = Port;
  std::ios::widen((char)*(undefined8 *)(*(long *)logFile + -0x18) + (char)logFile);
  local_b8 = logFile;
  std::ostream::put((char)logFile);
  poVar6 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"=== Analog Inputs ===",0x15);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  bVar9 = false;
  local_b0 = (ulong)(uint)curLine;
  Amp1394Console::Print
            (curLine,9,"This test uses the pot on the test board to set a voltage (+/-0.25V)");
  do {
    Amp1394Console::Print(curLine + 1,9,"Enter pot voltage: ");
    Amp1394Console::GetString(local_88,0x50);
    iVar3 = __isoc99_sscanf(local_88,"%lf",&local_f0);
    poVar2 = local_b8;
    if (iVar3 == 1) {
      bVar9 = true;
    }
  } while (!bVar9);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_b8,"   Input voltage: ",0x12);
  poVar6 = std::ostream::_M_insert<double>(local_f0);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  local_a8[2] = 0;
  local_a8[3] = 0;
  local_a8[0] = 0;
  local_a8[1] = 0;
  uVar8 = 0;
  iVar3 = 0;
  do {
    iVar4 = (*local_c8->_vptr_BasePort[0x1d])();
    if ((char)iVar4 != '\0') {
      lVar10 = 0;
      do {
        uVar5 = AmpIO::GetAnalogInput(Board,(uint)(qlaNum == 2) * 4 + (int)lVar10);
        local_a8[lVar10] = local_a8[lVar10] + (ulong)uVar5;
        lVar10 = lVar10 + 1;
      } while (lVar10 != 4);
      uVar8 = uVar8 + 1;
    }
    iVar3 = iVar3 + 1;
  } while (iVar3 != 0x10);
  cVar1 = (char)poVar2;
  if ((int)uVar8 < 1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar2,"   No valid readings!",0x15);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + cVar1);
    std::ostream::put(cVar1);
    std::ostream::flush();
    bVar9 = false;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"   Readings: ",0xd);
    bVar9 = true;
    lVar10 = 0;
    do {
      uVar7 = local_a8[lVar10] / (ulong)uVar8;
      local_a8[lVar10] = uVar7;
      auVar11._8_4_ = (int)(uVar7 >> 0x20);
      auVar11._0_8_ = uVar7;
      auVar11._12_4_ = 0x45300000;
      dStack_c0 = auVar11._8_8_ - 1.9342813113834067e+25;
      local_c8 = (BasePort *)
                 (((dStack_c0 + ((double)CONCAT44(0x43300000,(int)uVar7) - 4503599627370496.0)) *
                  4.5) / 65535.0);
      local_e8[lVar10] = local_c8;
      poVar6 = std::ostream::_M_insert<double>((double)local_c8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
      if (0.25 < ABS((double)local_c8 - local_f0)) {
        bVar9 = false;
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 != 4);
  }
  if (bVar9) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"- PASS",6);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + cVar1);
    std::ostream::put(cVar1);
    std::ostream::flush();
    __format = "Analog Input - PASS (%4.2lf %4.2lf %4.2lf %4.2lf)";
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"- FAIL",6);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + cVar1);
    std::ostream::put(cVar1);
    std::ostream::flush();
    __format = "Analog Input - FAIL (%4.2lf %4.2lf %4.2lf %4.2lf)";
  }
  sprintf(local_88,__format,local_e8[0],local_e8[1],local_e8[2],local_e8[3]);
  Amp1394Console::Print((int)local_b0 + 2,9,local_88);
  return bVar9;
}

Assistant:

bool TestAnalogInputs(int curLine, AmpIO &Board, BasePort *Port, std::ofstream &logFile, unsigned int qlaNum)
{
    int i, j;
    char buf[80];
    double measured;
    bool pass = true;

    int potStart = (qlaNum == 2) ? 4 : 0;

    logFile << std::endl << "=== Analog Inputs ===" << std::endl;
    Amp1394Console::Print(curLine++, 9, "This test uses the pot on the test board to set a voltage (+/-0.25V)");
    bool tmp_pass = false;
    while (!tmp_pass) {
        Amp1394Console::Print(curLine, 9, "Enter pot voltage: ");
        Amp1394Console::GetString(buf, sizeof(buf));
        if (sscanf(buf, "%lf", &measured) == 1) tmp_pass = true;
    }
    logFile << "   Input voltage: " << measured << std::endl;
    curLine++;
    // Average 16 readings to reduce noise
    unsigned long pot[4] = { 0, 0, 0, 0};
    double potV[4];
    int numValid = 0;
    for (i = 0; i < 16; i++) {
        if (Port->ReadAllBoards()) {
            numValid++;
            for (j = 0; j < 4; j++)
                pot[j] += Board.GetAnalogInput(potStart+j);
        }
    }
    if (numValid > 0) {
        logFile << "   Readings: ";
        for (j = 0; j < 4; j++) {
            pot[j] /= numValid;
            // Convert to voltage (16-bit converter, Vref = 4.5V)
            potV[j] = pot[j]*4.5/65535;
            logFile << potV[j] << " ";
            if (fabs(potV[j] - measured) > 0.25)
                pass = false;
        }
    }
    else {
        logFile << "   No valid readings!" << std::endl;
        pass = false;
    }
    if (pass) {
        logFile << "- PASS" << std::endl;
        sprintf(buf, "Analog Input - PASS (%4.2lf %4.2lf %4.2lf %4.2lf)",
                potV[0], potV[1], potV[2], potV[3]);
    }
    else {
        logFile << "- FAIL" << std::endl;
        sprintf(buf, "Analog Input - FAIL (%4.2lf %4.2lf %4.2lf %4.2lf)",
                potV[0], potV[1], potV[2], potV[3]);
    }

    Amp1394Console::Print(curLine, 9, buf);
    return pass;
}